

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

bool validation(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  reference this;
  reference __lhs;
  int local_30;
  int local_2c;
  int j;
  int i;
  Ship *ship_local;
  int col_local;
  int row_local;
  Board *board_local;
  
  local_2c = row + -1;
  do {
    if (row + 1 < local_2c) {
      return true;
    }
    for (local_30 = col + -1; local_30 <= col + 1; local_30 = local_30 + 1) {
      if ((((-1 < local_2c) && (local_2c <= board->row + -1)) && (-1 < local_30)) &&
         (local_30 <= board->column + -1)) {
        this = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&board->matrix,(long)local_2c);
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](this,(long)local_30);
        bVar1 = std::operator!=(__lhs,"~");
        if (bVar1) {
          return false;
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

bool validation( Board *board, int row, int col, Ship *ship )
{
	/* The loop begins at the left superior diagonal of the coordinate (x - 1, y - 1)
	 * and ends at the left inferior diagonal of the coordinate (x + 1, y + 1)
	 */
    for( int i = row - 1; i <= row + 1; i++ )
    {
        for( int j = col - 1; j <= col + 1; j++ )
        {
            //! If the values exceed the board's borders, they'll be skipped
            if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
            {
                continue;
            }
            //! If at least one space is different of water, the position is denied
            if( board->matrix[i][j] != "~" )
            {
                return false;
            }
        }
    }

    //! In the loop's end the position is validated
    return true;
}